

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall Tokenizer::processElement(Tokenizer *this,iterator *it)

{
  pointer this_00;
  pointer pRVar1;
  const_iterator __position;
  pointer pTVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  size_t sVar6;
  pointer pvVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  pointer pTVar11;
  pointer pRVar12;
  _List_node_base *p_Var13;
  _List_node_base **other;
  Token originalToken;
  size_t index;
  undefined1 local_c8 [64];
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Tokenizer *local_60;
  SymbolTable *local_58;
  _List_node_base **local_50;
  const_iterator local_48;
  size_t local_40;
  anon_class_8_1_8991fb9c local_38;
  
  local_60 = (Tokenizer *)it->_M_node;
  if (local_60 != this) {
    local_58 = &Global.symbolTable;
    do {
      p_Var13 = it->_M_node;
      if (*(char *)((long)&p_Var13[2]._M_next + 4) != '\0') break;
      bVar5 = false;
      if (*(int *)&p_Var13[2]._M_next == 1) {
        if (*(char *)&p_Var13[4]._M_prev != '\x04') {
LAB_0014b643:
          __assert_fail("std::holds_alternative<Identifier>(value)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                        ,0x4d,"const Identifier &Token::identifierValue() const");
        }
        other = &p_Var13[2]._M_prev;
        this_00 = (this->replacements).
                  super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar1 = (this->replacements).
                 super__Vector_base<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_00 == pRVar1) {
          bVar5 = false;
        }
        else {
          bVar5 = false;
          local_50 = other;
          do {
            pRVar12 = this_00 + 1;
            bVar8 = Identifier::operator==(&this_00->identifier,(Identifier *)other);
            if (bVar8) {
              p_Var13 = it->_M_node;
              local_48._M_node = p_Var13->_M_next;
              pTVar11 = (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar3 = *(undefined4 *)((long)&pTVar11->line + 4);
              sVar6 = pTVar11->column;
              uVar4 = *(undefined4 *)((long)&pTVar11->column + 4);
              *(int *)&p_Var13[1]._M_next = (int)pTVar11->line;
              *(undefined4 *)((long)&p_Var13[1]._M_next + 4) = uVar3;
              *(int *)&p_Var13[1]._M_prev = (int)sVar6;
              *(undefined4 *)((long)&p_Var13[1]._M_prev + 4) = uVar4;
              *(undefined8 *)((long)&p_Var13[1]._M_prev + 5) =
                   *(undefined8 *)((long)&pTVar11->column + 5);
              local_c8._0_8_ = &p_Var13[2]._M_prev;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                ::_S_vtable._M_arr
                [(long)(char)*(__index_type *)
                              ((long)&(pTVar11->value).
                                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                      .
                                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              + 0x20) + 1]._M_data)
                        ((anon_class_8_1_8991fb9c *)local_c8,&pTVar11->value);
              other = local_50;
              std::__cxx11::string::_M_assign((string *)(p_Var13 + 5));
              std::__cxx11::list<Token,std::allocator<Token>>::
              insert<__gnu_cxx::__normal_iterator<Token_const*,std::vector<Token,std::allocator<Token>>>,void>
                        ((list<Token,std::allocator<Token>> *)this,local_48,
                         (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,
                         (this_00->value).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              p_Var13 = it->_M_node;
              if (*(int *)&p_Var13[2]._M_next == 1) {
                if (*(char *)&p_Var13[4]._M_prev != '\x04') goto LAB_0014b643;
                bVar9 = Identifier::operator!=
                                  ((Identifier *)other,(Identifier *)&p_Var13[2]._M_prev);
                if (!bVar9) goto LAB_0014b3ee;
              }
              bVar5 = true;
            }
LAB_0014b3ee:
            this_00 = pRVar12;
          } while (!bVar8 && pRVar12 != pRVar1);
        }
        iVar10 = 2;
        if (!bVar5) {
          bVar8 = SymbolTable::findEquation
                            (local_58,(Identifier *)other,Global.FileInfo.FileNum,Global.Section,
                             &local_40);
          sVar6 = local_40;
          pvVar7 = equValues.
                   super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar10 = 0;
          if ((bVar8) &&
             ((__position._M_node = it->_M_node->_M_next, (Tokenizer *)__position._M_node == this ||
              (iVar10 = 3, *(int *)&__position._M_node[2]._M_next != 0x21)))) {
            local_78._8_8_ = 0;
            local_c8._48_8_ = 0;
            local_c8._56_8_ = 0;
            local_c8._32_8_ = 0;
            local_c8._40_8_ = 0;
            local_c8._16_4_ = Invalid;
            local_c8[0x14] = false;
            local_c8._21_3_ = 0;
            local_c8._24_8_ = 0;
            local_c8._0_8_ =
                 (_Copy_assign_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                  *)0x0;
            local_c8._8_5_ = 0;
            local_c8._13_3_ = 0;
            sStack_80 = 0;
            local_78._M_allocated_capacity = 0;
            local_88._M_p = (pointer)&local_78;
            std::__cxx11::list<Token,_std::allocator<Token>_>::insert
                      (&this->tokens,__position,
                       ((long)equValues.
                              super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_40].
                              super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)equValues.
                              super__Vector_base<std::vector<Token,_std::allocator<Token>_>,_std::allocator<std::vector<Token,_std::allocator<Token>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_40].
                              super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                              super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 - 1,
                       (value_type *)local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_p != &local_78) {
              operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
            ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                               *)(local_c8 + 0x18));
            p_Var13 = it->_M_node;
            local_c8._16_5_ =
                 (undefined5)((ulong)*(undefined8 *)((long)&p_Var13[1]._M_prev + 5) >> 0x18);
            local_c8._0_8_ = p_Var13[1]._M_next;
            local_c8._8_5_ = SUB85(p_Var13[1]._M_prev,0);
            local_c8._13_3_ = (undefined3)((ulong)p_Var13[1]._M_prev >> 0x28);
            std::__detail::__variant::
            _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
            _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                             *)(local_c8 + 0x18),
                            (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                             *)&p_Var13[2]._M_prev);
            local_88._M_p = (pointer)&local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,p_Var13[5]._M_next,
                       (long)&(p_Var13[5]._M_prev)->_M_next + (long)p_Var13[5]._M_next);
            pTVar11 = pvVar7[sVar6].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pTVar2 = pvVar7[sVar6].super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pTVar11 != pTVar2) {
              p_Var13 = it->_M_node;
              do {
                *(undefined8 *)((long)&p_Var13[1]._M_prev + 5) =
                     *(undefined8 *)((long)&pTVar11->column + 5);
                uVar3 = *(undefined4 *)((long)&pTVar11->line + 4);
                sVar6 = pTVar11->column;
                uVar4 = *(undefined4 *)((long)&pTVar11->column + 4);
                *(int *)&p_Var13[1]._M_next = (int)pTVar11->line;
                *(undefined4 *)((long)&p_Var13[1]._M_next + 4) = uVar3;
                *(int *)&p_Var13[1]._M_prev = (int)sVar6;
                *(undefined4 *)((long)&p_Var13[1]._M_prev + 4) = uVar4;
                local_38.this =
                     (_Copy_assign_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                      *)&p_Var13[2]._M_prev;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)*(__index_type *)
                                ((long)&(pTVar11->value).
                                        super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                        .
                                        super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                        .
                                        super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                        .
                                        super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                        .
                                        super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                        .
                                        super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                + 0x20) + 1]._M_data)(&local_38,&pTVar11->value);
                std::__cxx11::string::_M_assign((string *)(p_Var13 + 5));
                p_Var13[1]._M_next = (_List_node_base *)local_c8._0_8_;
                p_Var13[1]._M_prev = (_List_node_base *)CONCAT35(local_c8._13_3_,local_c8._8_5_);
                p_Var13 = p_Var13->_M_next;
                pTVar11 = pTVar11 + 1;
              } while (pTVar11 != pTVar2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_p != &local_78) {
              operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
            ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                               *)(local_c8 + 0x18));
            bVar5 = true;
            iVar10 = 2;
          }
        }
        if (iVar10 == 0) goto LAB_0014b605;
      }
      else {
LAB_0014b605:
        if (!bVar5) {
          *(undefined1 *)((long)&it->_M_node[2]._M_next + 4) = 1;
        }
        iVar10 = 0;
      }
    } while (iVar10 != 3);
  }
  return local_60 != this;
}

Assistant:

bool Tokenizer::processElement(TokenList::iterator& it)
{
	if (it == tokens.end())
		return false;

	while (!(*it).checked)
	{
		bool replaced = false;
		if ((*it).type == TokenType::Identifier)
		{
			const Identifier &identifier = (*it).identifierValue();
			for (const Replacement& replacement: replacements)
			{
				// if the identifier matches, add all of its tokens
				if (replacement.identifier == identifier)
				{
					TokenList::iterator insertIt = it;
					++insertIt;
				
					// replace old token with the new tokens
					// replace the first token manually so that any iterators
					// are still guaranteed to be valid
					(*it) = replacement.value[0];
					tokens.insert(insertIt,replacement.value.begin()+1, replacement.value.end());

					// If the value at this position didn't change, then just keep going.
					// Otherwise we'd be stuck in an endless replace loop
					if ((*it).type != TokenType::Identifier || identifier != (*it).identifierValue())
						replaced = true;
					break;
				}
			}

			if (replaced)
				continue;

			// check for equs
			size_t index;
			if (Global.symbolTable.findEquation(identifier,Global.FileInfo.FileNum,Global.Section,index))
			{
				TokenList::iterator nextIt = it;
				std::advance(nextIt, 1);
			
				// check if this is another equ with the same name.
				// if so, keep equ redefinitions for later error handling
				if (nextIt != tokens.end() && nextIt->type == TokenType::Equ)
					break;

				// make room for the replacement tokens
				const std::vector<Token>& replacement = equValues[index];
				tokens.insert(nextIt, replacement.size()-1, {});

				// insert replacement tokens, while keeping the file info of the original token
				Token originalToken = *it;

				TokenList::iterator insertIt = it;
				for (const Token& token: replacement)
				{
					(*insertIt) = token;
					insertIt->line = originalToken.line;
					insertIt->column = originalToken.column;
					std::advance(insertIt, 1);
				}

				replaced = true;
				continue;
			}
		}

		if (!replaced)
			(*it).checked = true;
	}

	return true;
}